

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
::value_destroy_n(btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                  *this,field_type i,field_type n,allocator_type *alloc)

{
  slot_type *psVar1;
  slot_type *end;
  slot_type *s;
  allocator_type *alloc_local;
  field_type n_local;
  field_type i_local;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
  *this_local;
  
  next_generation(this);
  end = slot(this,(ulong)i);
  psVar1 = slot(this,(long)(int)((uint)i + (uint)n));
  for (; end != psVar1; end = end + 1) {
    common_policy_traits<absl::lts_20250127::container_internal::set_slot_policy<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,void>
    ::
    destroy<std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>
              (alloc,end);
    SanitizerPoisonObject<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>
              (end);
  }
  return;
}

Assistant:

void value_destroy_n(const field_type i, const field_type n,
                       allocator_type *alloc) {
    next_generation();
    for (slot_type *s = slot(i), *end = slot(i + n); s != end; ++s) {
      params_type::destroy(alloc, s);
      absl::container_internal::SanitizerPoisonObject(s);
    }
  }